

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O0

cs_err ARM_option(cs_struct *handle,cs_opt_type type,size_t value)

{
  cs_mode in_EDX;
  int in_ESI;
  cs_struct *in_RDI;
  
  if (in_ESI == 1) {
    ARM_getRegName(in_RDI,in_EDX);
    in_RDI->syntax = in_EDX;
  }
  else if (in_ESI == 3) {
    if ((in_EDX & CS_MODE_M680X_6801) == CS_MODE_ARM) {
      in_RDI->disasm = ARM_getInstruction;
    }
    else {
      in_RDI->disasm = Thumb_getInstruction;
    }
    in_RDI->mode = in_EDX;
  }
  return CS_ERR_OK;
}

Assistant:

cs_err ARM_option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		case CS_OPT_MODE:
			if (value & CS_MODE_THUMB)
				handle->disasm = Thumb_getInstruction;
			else
				handle->disasm = ARM_getInstruction;

			handle->mode = (cs_mode)value;

			break;
		case CS_OPT_SYNTAX:
			ARM_getRegName(handle, (int)value);
			handle->syntax = (int)value;
			break;
		default:
			break;
	}

	return CS_ERR_OK;
}